

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

SceneLoader * __thiscall
COLLADASaxFWL::RootParser15::beginCommon<COLLADASaxFWL::SceneLoader,COLLADASaxFWL::SceneLoader15>
          (RootParser15 *this)

{
  SceneLoader *this_00;
  IParserImpl *parserImpl;
  IFilePartLoader *in_RDI;
  SceneLoader *unaff_retaddr;
  SceneLoader15 *loader15;
  SceneLoader *loader;
  SceneLoader *in_stack_ffffffffffffffa8;
  SceneLoader15 *in_stack_ffffffffffffffb0;
  IParserImpl *local_48;
  IFilePartLoader *callingFilePartLoader;
  
  callingFilePartLoader = in_RDI;
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)in_stack_ffffffffffffffb0);
  this_00 = (SceneLoader *)operator_new(0x90);
  SceneLoader::SceneLoader(unaff_retaddr,callingFilePartLoader);
  parserImpl = (IParserImpl *)operator_new(0x20);
  SceneLoader15::SceneLoader15(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader(in_RDI[1].mPartLoader,(IFilePartLoader *)this_00);
  local_48 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    local_48 = parserImpl + 1;
  }
  (*((in_RDI[1].mPartLoader)->super_ExtraDataLoader)._vptr_ExtraDataLoader[10])
            (in_RDI[1].mPartLoader,local_48);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommon( )
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		return loader;
	}